

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smf.c
# Opt level: O1

smf_event_t * smf_peek_next_event_from_track(smf_track_t *track)

{
  int event_number;
  smf_event_t *psVar1;
  
  event_number = track->next_event_number;
  if (event_number == -1) {
    return (smf_event_t *)0x0;
  }
  if (0 < event_number) {
    if (track->events_array->len != 0) {
      psVar1 = smf_track_get_event_by_number(track,event_number);
      return psVar1;
    }
    __assert_fail("track->events_array->len != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf.c"
                  ,0x2db,"smf_event_t *smf_peek_next_event_from_track(smf_track_t *)");
  }
  __assert_fail("track->next_event_number >= 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf.c"
                ,0x2da,"smf_event_t *smf_peek_next_event_from_track(smf_track_t *)");
}

Assistant:

static smf_event_t *
smf_peek_next_event_from_track(smf_track_t *track)
{
	smf_event_t *event;

	/* End of track? */
	if (track->next_event_number == -1)
		return (NULL);

	assert(track->next_event_number >= 1);
	assert(track->events_array->len != 0);

	event = smf_track_get_event_by_number(track, track->next_event_number);

	return (event);
}